

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deUniquePtr.hpp
# Opt level: O0

void __thiscall
de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::reset
          (UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *this)

{
  UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *this_local;
  
  if ((this->m_data).ptr != (Buffer *)0x0) {
    DefaultDeleter<vkt::image::Buffer>::operator()
              ((DefaultDeleter<vkt::image::Buffer> *)&(this->m_data).field_0x8,(this->m_data).ptr);
    (this->m_data).ptr = (Buffer *)0x0;
  }
  return;
}

Assistant:

void UniqueBase<T, D>::reset (void)
{
	if (m_data.ptr != DE_NULL)
	{
		m_data.deleter(m_data.ptr);
		m_data.ptr = DE_NULL;
	}
}